

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O3

Cord * __thiscall absl::lts_20240722::Cord::operator=(Cord *this,string_view src)

{
  RefcountAndFlags *pRVar1;
  byte bVar2;
  long lVar3;
  CordzUpdateScope CVar4;
  CordzInfo *in_RAX;
  CordzInfo *pCVar5;
  Nullable<CordRep_*> pCVar6;
  Cord *this_00;
  sbyte sVar7;
  sbyte sVar8;
  Nullable<const_char_*> data;
  size_t extraout_RDX;
  size_t alloc_hint;
  size_t extraout_RDX_00;
  uint uVar9;
  ulong length;
  CordRep *node;
  CordzUpdateScope scope;
  CordzUpdateScope local_28;
  
  data = src._M_str;
  length = src._M_len;
  if (((this->contents_).data_.rep_.field_0.data[0] & 1U) == 0) {
    node = (CordRep *)0x0;
  }
  else {
    node = (this->contents_).data_.rep_.field_0.as_tree.rep;
  }
  if (length < 0x10) {
    if (node == (CordRep *)0x0) {
      cord_internal::InlineData::set_inline_data((InlineData *)this,data,length);
      return this;
    }
    local_28.info_ = in_RAX;
    pCVar5 = cord_internal::InlineData::cordz_info((InlineData *)this);
    if (pCVar5 != (CordzInfo *)0x0) {
      absl::lts_20240722::cord_internal::CordzInfo::Untrack();
    }
    cord_internal::InlineData::set_inline_data((InlineData *)this,data,length);
    LOCK();
    pRVar1 = &node->refcount;
    uVar9 = (pRVar1->count_).super___atomic_base<int>._M_i;
    (pRVar1->count_).super___atomic_base<int>._M_i =
         (pRVar1->count_).super___atomic_base<int>._M_i + -2;
    UNLOCK();
    if ((uVar9 & 1) != 0 || 0 < (int)uVar9) {
      if (uVar9 != 2) {
        return this;
      }
      absl::lts_20240722::cord_internal::CordRep::Destroy(node);
      return this;
    }
  }
  else {
    if (node == (CordRep *)0x0) {
      pCVar6 = NewTree(data,length,(size_t)data);
      if (pCVar6 == (Nullable<CordRep_*>)0x0) {
        __assert_fail("rep",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/cord.h"
                      ,0x4f2,
                      "void absl::Cord::InlineRep::EmplaceTree(absl::Nonnull<CordRep *>, MethodIdentifier)"
                     );
      }
      (this->contents_).data_.rep_.field_0.as_tree.rep = pCVar6;
      (this->contents_).data_.rep_.field_0.as_tree.cordz_info = 1;
      this_00 = (Cord *)__tls_get_addr(&PTR_0011cfd0);
      lVar3 = (this_00->contents_).data_.rep_.field_0.as_tree.cordz_info;
      if (1 < lVar3) {
        (this_00->contents_).data_.rep_.field_0.as_tree.cordz_info = lVar3 + -1;
        return this;
      }
      operator=(this_00);
      return this;
    }
    local_28.info_ = cord_internal::InlineData::cordz_info((InlineData *)this);
    alloc_hint = extraout_RDX;
    if (local_28.info_ != (CordzInfo *)0x0) {
      absl::lts_20240722::cord_internal::CordzInfo::Lock((MethodIdentifier)local_28.info_);
      alloc_hint = extraout_RDX_00;
    }
    bVar2 = node->tag;
    if (5 < bVar2) {
      if (0xf8 < bVar2) {
LAB_0010b38d:
        __assert_fail("tag >= FLAT && tag <= MAX_FLAT_TAG",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_flat.h"
                      ,0xb6,"CordRepFlat *absl::cord_internal::CordRep::flat()");
      }
      sVar8 = 0xc;
      if (bVar2 < 0xbb) {
        sVar8 = 6;
      }
      uVar9 = 0xfff47ff3;
      if (bVar2 < 0xbb) {
        uVar9 = 0xfffff173;
      }
      sVar7 = 3;
      if (0x42 < bVar2) {
        sVar7 = sVar8;
      }
      alloc_hint = 0xffffffe3;
      if (0x42 < bVar2) {
        alloc_hint = (size_t)uVar9;
      }
      if ((length <= (ulong)(long)(int)(((uint)bVar2 << sVar7) + (int)alloc_hint)) &&
         ((node->refcount).count_.super___atomic_base<int>._M_i == 2)) {
        if ((node->tag - 0xf9 < 7) || (node->tag < 6)) goto LAB_0010b38d;
        memmove(node->storage,data,length);
        node->length = length;
        VerifyTree(node);
        goto LAB_0010b2dc;
      }
    }
    pCVar6 = NewTree(data,length,alloc_hint);
    CVar4.info_ = local_28.info_;
    if (pCVar6 == (Nullable<CordRep_*>)0x0) {
      __assert_fail("rep",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/cord.h"
                    ,0x500,
                    "void absl::Cord::InlineRep::SetTree(absl::Nonnull<CordRep *>, const CordzUpdateScope &)"
                   );
    }
    if (((this->contents_).data_.rep_.field_0.data[0] & 1U) == 0) {
      __assert_fail("data_.is_tree()",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/cord.h"
                    ,0x501,
                    "void absl::Cord::InlineRep::SetTree(absl::Nonnull<CordRep *>, const CordzUpdateScope &)"
                   );
    }
    (this->contents_).data_.rep_.field_0.as_tree.rep = pCVar6;
    if (local_28.info_ != (CordzInfo *)0x0) {
      absl::lts_20240722::Mutex::AssertHeld();
      *(Nullable<CordRep_*> *)(CVar4.info_ + 0x40) = pCVar6;
    }
    LOCK();
    pRVar1 = &node->refcount;
    uVar9 = (pRVar1->count_).super___atomic_base<int>._M_i;
    (pRVar1->count_).super___atomic_base<int>._M_i =
         (pRVar1->count_).super___atomic_base<int>._M_i + -2;
    UNLOCK();
    if ((uVar9 & 1) != 0 || 0 < (int)uVar9) {
      if (uVar9 == 2) {
        absl::lts_20240722::cord_internal::CordRep::Destroy(node);
      }
LAB_0010b2dc:
      cord_internal::CordzUpdateScope::~CordzUpdateScope(&local_28);
      return this;
    }
  }
  __assert_fail("refcount > 0 || refcount & kImmortalFlag",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                ,0xaa,"bool absl::cord_internal::RefcountAndFlags::DecrementExpectHighRefcount()");
}

Assistant:

Cord& Cord::operator=(absl::string_view src) {
  auto constexpr method = CordzUpdateTracker::kAssignString;
  const char* data = src.data();
  size_t length = src.size();
  CordRep* tree = contents_.tree();
  if (length <= InlineRep::kMaxInline) {
    // Embed into this->contents_, which is somewhat subtle:
    // - MaybeUntrackCord must be called before Unref(tree).
    // - MaybeUntrackCord must be called before set_data() clobbers cordz_info.
    // - set_data() must be called before Unref(tree) as it may reference tree.
    if (tree != nullptr) CordzInfo::MaybeUntrackCord(contents_.cordz_info());
    contents_.set_data(data, length);
    if (tree != nullptr) CordRep::Unref(tree);
    return *this;
  }
  if (tree != nullptr) {
    CordzUpdateScope scope(contents_.cordz_info(), method);
    if (tree->IsFlat() && tree->flat()->Capacity() >= length &&
        tree->refcount.IsOne()) {
      // Copy in place if the existing FLAT node is reusable.
      memmove(tree->flat()->Data(), data, length);
      tree->length = length;
      VerifyTree(tree);
      return *this;
    }
    contents_.SetTree(NewTree(data, length, 0), scope);
    CordRep::Unref(tree);
  } else {
    contents_.EmplaceTree(NewTree(data, length, 0), method);
  }
  return *this;
}